

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

void __thiscall GLRParser::GLRParser(GLRParser *this,CFG *cfg,bool verbose)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  allocator<Production_*> *this_01;
  initializer_list<Production_*> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<Production_*> __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  undefined4 __val;
  bool bVar1;
  __type _Var2;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  reference pbVar5;
  vector<Production_*,_std::allocator<Production_*>_> *pvVar6;
  string *psVar7;
  Production *pPVar8;
  GLRState *pGVar9;
  reference ppPVar10;
  Production *this_02;
  ulong uVar11;
  size_type sVar12;
  reference ppGVar13;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *psVar14;
  size_type sVar15;
  size_type sVar16;
  reference ppPVar17;
  size_type sVar18;
  reference __lhs;
  Production *production_00;
  Production *production_01;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar19;
  pair<std::_Rb_tree_const_iterator<GLRState_*>,_bool> pVar20;
  pair<std::_Rb_tree_const_iterator<Production_*>,_bool> pVar21;
  __type local_981;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  undefined1 local_6e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo_1;
  Production *rule;
  iterator __end2_3;
  iterator __begin2_3;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *__range2_3;
  bool containsTerminalProduction;
  GLRState *state;
  iterator __end1_3;
  iterator __begin1_3;
  set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_> *__range1_3;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> local_670;
  string local_640;
  GLRState *local_620;
  GLRState *s2;
  iterator __end2_2;
  iterator __begin2_2;
  set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_> *__range2_2;
  GLRState *pGStack_5f8;
  bool stateExists;
  GLRState *closureY;
  undefined1 local_5e8;
  string local_5e0;
  undefined1 local_5c0 [8];
  string var;
  Production *local_590;
  Production *prod;
  iterator __end3;
  iterator __begin3;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *__range3;
  Production *production_3;
  iterator __end2_1;
  iterator __begin2_1;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *__range2_1;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> sMovedRightOfX;
  string local_510;
  GLRParser *local_4f0;
  Production *production_2;
  iterator __end2;
  iterator __begin2;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *__range2;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> sImmRightX;
  string local_498;
  _Base_ptr local_478;
  _Self local_470;
  _Rb_tree_const_iterator<Production_*> local_468;
  _Rb_tree_const_iterator<Production_*> local_460;
  _Self local_458;
  GLRParser *local_450;
  Production *production_1;
  iterator productionItr;
  GLRState *glrState;
  iterator glrStateItr;
  GLRState *pGStack_428;
  int i_1;
  GLRState *stateA;
  string s;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> local_3e8;
  string local_3b8;
  GLRState *local_398;
  GLRState *newState;
  Production *local_388;
  iterator local_380;
  size_type local_378;
  undefined1 local_370 [8];
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> startClosure;
  Production *local_330;
  Production *markedProduction;
  value_type local_320;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f8;
  const_iterator local_2f0;
  undefined1 local_2e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodToMarked;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *prodTo;
  Production *production;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Production_*,_std::allocator<Production_*>_> *__range1_2;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> markedProductions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  iterator local_240;
  size_type local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  allocator<char> local_211;
  string local_210;
  Production *local_1f0;
  iterator local_1e8;
  size_type local_1e0;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> local_1d8;
  allocator<char> local_1a1;
  string local_1a0;
  undefined1 local_17a;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  iterator local_150;
  size_type local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  Production *local_128;
  Production *start;
  undefined1 local_118;
  string local_110 [32];
  string local_f0 [8];
  string oldStartState;
  undefined1 local_c8 [4];
  int stateNr;
  string startS;
  vector<Production_*,_std::allocator<Production_*>_> productionsP;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool verbose_local;
  CFG *cfg_local;
  GLRParser *this_local;
  
  this->verbose = verbose;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->nonTerminalsV);
  this->acceptState = (GLRState *)0x0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->terminalsT);
  std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::set(&this->states);
  CFG::splitUpLongerTerminals(cfg);
  pvVar4 = CFG::getNonTerminalsV_abi_cxx11_(cfg);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar4);
  c = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(pvVar4);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&c), bVar1) {
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->nonTerminalsV,pbVar5);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pvVar4 = CFG::getTerminalsT_abi_cxx11_(cfg);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar4);
  c_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(pvVar4);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&c_1), bVar1) {
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_1);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->terminalsT,pbVar5);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  pvVar6 = CFG::getProductionsP(cfg);
  std::vector<Production_*,_std::allocator<Production_*>_>::vector
            ((vector<Production_*,_std::allocator<Production_*>_> *)((long)&startS.field_2 + 8),
             pvVar6);
  psVar7 = CFG::getStartS_abi_cxx11_(cfg);
  std::__cxx11::string::string((string *)local_c8,(string *)psVar7);
  oldStartState.field_2._12_4_ = 1;
  std::__cxx11::string::string(local_f0,(string *)local_c8);
  startStateName_abi_cxx11_();
  std::__cxx11::string::operator=((string *)local_c8,local_110);
  std::__cxx11::string::~string(local_110);
  oldStartState.field_2._12_4_ = oldStartState.field_2._12_4_ + 1;
  pVar19 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::insert(&this->nonTerminalsV,(value_type *)local_c8);
  start = (Production *)pVar19.first._M_node;
  local_118 = pVar19.second;
  pPVar8 = (Production *)operator_new(0x38);
  local_17a = 1;
  local_178 = &local_170;
  std::__cxx11::string::string((string *)local_178,local_f0);
  local_150 = &local_170;
  local_148 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_179);
  __l_02._M_len = local_148;
  __l_02._M_array = local_150;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_140,__l_02,&local_179);
  Production::Production(pPVar8,(string *)local_c8,&local_140);
  local_17a = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_179);
  local_7a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_150;
  do {
    local_7a8 = local_7a8 + -1;
    std::__cxx11::string::~string((string *)local_7a8);
  } while (local_7a8 != &local_170);
  local_128 = pPVar8;
  std::vector<Production_*,_std::allocator<Production_*>_>::push_back
            ((vector<Production_*,_std::allocator<Production_*>_> *)((long)&startS.field_2 + 8),
             &local_128);
  pGVar9 = (GLRState *)operator_new(0xb8);
  markedProductions._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"accept",&local_1a1);
  pPVar8 = (Production *)operator_new(0x38);
  markedProductions._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"accept",&local_211);
  std::__cxx11::string::string((string *)&local_260,(string *)local_c8);
  local_240 = &local_260;
  local_238 = 1;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&markedProductions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l_00._M_len = local_238;
  __l_00._M_array = local_240;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_230,__l_00,this_00);
  Production::Production(pPVar8,&local_210,&local_230);
  markedProductions._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  local_1e8 = &local_1f0;
  local_1e0 = 1;
  this_01 = (allocator<Production_*> *)
            ((long)&markedProductions._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
  local_1f0 = pPVar8;
  std::allocator<Production_*>::allocator(this_01);
  __l_01._M_len = local_1e0;
  __l_01._M_array = local_1e8;
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            (&local_1d8,__l_01,
             (less<Production_*> *)
             ((long)&markedProductions._M_t._M_impl.super__Rb_tree_header._M_node_count + 5),this_01
            );
  GLRState::GLRState(pGVar9,&local_1a0,&local_1d8);
  markedProductions._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
  this->acceptState = pGVar9;
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::~set(&local_1d8);
  std::allocator<Production_*>::~allocator
            ((allocator<Production_*> *)
             ((long)&markedProductions._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_230);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&markedProductions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  local_7f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240;
  do {
    local_7f0 = local_7f0 + -1;
    std::__cxx11::string::~string((string *)local_7f0);
  } while (local_7f0 != &local_260);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  memset(&__range1_2,0,0x30);
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
             &__range1_2);
  pvVar6 = (vector<Production_*,_std::allocator<Production_*>_> *)((long)&startS.field_2 + 8);
  __end1_2 = std::vector<Production_*,_std::allocator<Production_*>_>::begin(pvVar6);
  production = (Production *)std::vector<Production_*,_std::allocator<Production_*>_>::end(pvVar6);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
                             *)&production), bVar1) {
    ppPVar10 = __gnu_cxx::
               __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
               ::operator*(&__end1_2);
    pPVar8 = *ppPVar10;
    pvVar4 = Production::getToP_abi_cxx11_(pPVar8);
    for (prodToMarked.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        uVar11 = (ulong)prodToMarked.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
        sVar18 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(pvVar4), uVar11 <= sVar18;
        prodToMarked.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             prodToMarked.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2e8,pvVar4);
      local_300._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2e8);
      local_2f8 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator+(&local_300,
                              (long)prodToMarked.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_2f0,&local_2f8);
      getMarker_abi_cxx11_();
      markedProduction =
           (Production *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2e8,local_2f0,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      this_02 = (Production *)operator_new(0x38);
      psVar7 = Production::getFromP_abi_cxx11_(pPVar8);
      Production::Production
                (this_02,psVar7,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2e8);
      local_330 = this_02;
      pVar21 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::
               insert((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                      &__range1_2,&local_330);
      startClosure._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pVar21.first._M_node;
      psVar7 = Production::getFromP_abi_cxx11_(pPVar8);
      _Var2 = std::operator==(psVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_c8);
      if ((_Var2) &&
         (prodToMarked.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0)) {
        local_128 = local_330;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2e8);
    }
    __gnu_cxx::
    __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>::
    operator++(&__end1_2);
  }
  local_388 = local_128;
  local_380 = &local_388;
  local_378 = 1;
  std::allocator<Production_*>::allocator((allocator<Production_*> *)((long)&newState + 6));
  __l._M_len = local_378;
  __l._M_array = local_380;
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)local_370,
             __l,(less<Production_*> *)((long)&newState + 7),
             (allocator<Production_*> *)((long)&newState + 6));
  std::allocator<Production_*>::~allocator((allocator<Production_*> *)((long)&newState + 6));
  do {
    bVar1 = closure(this,(set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                          *)local_370,
                    (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                    &__range1_2);
  } while (bVar1);
  pGVar9 = (GLRState *)operator_new(0xb8);
  std::__cxx11::string::string((string *)&local_3b8,(string *)local_c8);
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            (&local_3e8,
             (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)local_370)
  ;
  GLRState::GLRState(pGVar9,&local_3b8,&local_3e8);
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::~set(&local_3e8);
  std::__cxx11::string::~string((string *)&local_3b8);
  local_398 = pGVar9;
  pVar20 = std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::insert
                     (&this->states,&local_398);
  s.field_2._8_8_ = pVar20.first._M_node;
  this->startState = local_398;
  do {
    std::__cxx11::string::string((string *)&stateA);
    pGStack_428 = (GLRState *)0x0;
    for (glrStateItr._M_node._4_4_ = 0; uVar11 = (ulong)glrStateItr._M_node._4_4_,
        sVar12 = std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::size
                           (&this->states), uVar11 < sVar12;
        glrStateItr._M_node._4_4_ = glrStateItr._M_node._4_4_ + 1) {
      glrState = (GLRState *)
                 std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::begin
                           (&this->states);
      std::advance<std::_Rb_tree_const_iterator<GLRState*>,int>
                ((_Rb_tree_const_iterator<GLRState_*> *)&glrState,glrStateItr._M_node._4_4_);
      ppGVar13 = std::_Rb_tree_const_iterator<GLRState_*>::operator*
                           ((_Rb_tree_const_iterator<GLRState_*> *)&glrState);
      productionItr._M_node = (_Base_ptr)*ppGVar13;
      psVar14 = GLRState::getProductions((GLRState *)productionItr._M_node);
      sVar15 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::size
                         (psVar14);
      psVar14 = GLRState::getProdEstablished((GLRState *)productionItr._M_node);
      sVar16 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::size
                         (psVar14);
      if (sVar16 < sVar15) {
        psVar14 = GLRState::getProductions((GLRState *)productionItr._M_node);
        production_1 = (Production *)
                       std::
                       set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::
                       begin(psVar14);
        while( true ) {
          psVar14 = GLRState::getProdEstablished((GLRState *)productionItr._M_node);
          local_460._M_node =
               (_Base_ptr)
               std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::begin
                         (psVar14);
          psVar14 = GLRState::getProdEstablished((GLRState *)productionItr._M_node);
          local_468._M_node =
               (_Base_ptr)
               std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::end
                         (psVar14);
          ppPVar17 = std::_Rb_tree_const_iterator<Production_*>::operator*
                               ((_Rb_tree_const_iterator<Production_*> *)&production_1);
          local_458._M_node =
               (_Base_ptr)
               std::find<std::_Rb_tree_const_iterator<Production*>,Production*>
                         (local_460,local_468,ppPVar17);
          psVar14 = GLRState::getProdEstablished((GLRState *)productionItr._M_node);
          local_470._M_node =
               (_Base_ptr)
               std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::end
                         (psVar14);
          bVar1 = std::operator==(&local_458,&local_470);
          if (bVar1) break;
          local_478 = (_Base_ptr)
                      std::_Rb_tree_const_iterator<Production_*>::operator++
                                ((_Rb_tree_const_iterator<Production_*> *)&production_1,0);
        }
        ppPVar17 = std::_Rb_tree_const_iterator<Production_*>::operator*
                             ((_Rb_tree_const_iterator<Production_*> *)&production_1);
        local_450 = (GLRParser *)*ppPVar17;
        GLRState::increaseEstablished((GLRState *)productionItr._M_node,(Production *)local_450);
        symbolAfterMarker_abi_cxx11_(&local_498,local_450,production_00);
        std::__cxx11::string::operator=((string *)&stateA,(string *)&local_498);
        std::__cxx11::string::~string((string *)&local_498);
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          pGStack_428 = (GLRState *)productionItr._M_node;
          break;
        }
        glrStateItr._M_node._4_4_ = glrStateItr._M_node._4_4_ + -1;
      }
    }
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) == 0) {
      std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
                ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                 &__range2);
      psVar14 = GLRState::getProductions(pGStack_428);
      __end2 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::begin
                         (psVar14);
      production_2 = (Production *)
                     std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                     ::end(psVar14);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&production_2), bVar1) {
        ppPVar17 = std::_Rb_tree_const_iterator<Production_*>::operator*(&__end2);
        local_4f0 = (GLRParser *)*ppPVar17;
        symbolAfterMarker_abi_cxx11_(&local_510,local_4f0,production_01);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&stateA,&local_510);
        std::__cxx11::string::~string((string *)&local_510);
        if (_Var2) {
          pVar21 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::
                   insert((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                           *)&__range2,(value_type *)&local_4f0);
          sMovedRightOfX._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)pVar21.first._M_node;
        }
        std::_Rb_tree_const_iterator<Production_*>::operator++(&__end2);
      }
      std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
                ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                 &__range2_1);
      __end2_1 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::
                 begin((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                       &__range2);
      production_3 = (Production *)
                     std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                     ::end((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                            *)&__range2);
      while (bVar1 = std::operator!=(&__end2_1,(_Self *)&production_3),
            __val = oldStartState.field_2._12_4_, bVar1) {
        ppPVar17 = std::_Rb_tree_const_iterator<Production_*>::operator*(&__end2_1);
        pPVar8 = *ppPVar17;
        __end3 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::
                 begin((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                       &__range1_2);
        prod = (Production *)
               std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::end
                         ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                           *)&__range1_2);
        while (bVar1 = std::operator!=(&__end3,(_Self *)&prod), bVar1) {
          ppPVar17 = std::_Rb_tree_const_iterator<Production_*>::operator*(&__end3);
          local_590 = *ppPVar17;
          bVar1 = isMarkerMovedRight(pPVar8,local_590);
          if (bVar1) {
            pVar21 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                     ::insert((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                               *)&__range2_1,&local_590);
            var.field_2._8_8_ = pVar21.first._M_node;
          }
          std::_Rb_tree_const_iterator<Production_*>::operator++(&__end3);
        }
        std::_Rb_tree_const_iterator<Production_*>::operator++(&__end2_1);
      }
      oldStartState.field_2._12_4_ = oldStartState.field_2._12_4_ + 1;
      std::__cxx11::to_string(&local_5e0,__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
                     "STATE#",&local_5e0);
      std::__cxx11::string::~string((string *)&local_5e0);
      pVar19 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(&this->nonTerminalsV,(value_type *)local_5c0);
      closureY = (GLRState *)pVar19.first._M_node;
      local_5e8 = pVar19.second;
      do {
        bVar1 = closure(this,(set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                              *)&__range2_1,
                        (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *
                        )&__range1_2);
      } while (bVar1);
      pGStack_5f8 = (GLRState *)0x0;
      bVar1 = false;
      __end2_2 = std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::begin
                           (&this->states);
      s2 = (GLRState *)
           std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::end
                     (&this->states);
      while (bVar3 = std::operator!=(&__end2_2,(_Self *)&s2), bVar3) {
        ppGVar13 = std::_Rb_tree_const_iterator<GLRState_*>::operator*(&__end2_2);
        local_620 = *ppGVar13;
        psVar14 = GLRState::getProductions(local_620);
        bVar3 = std::operator==(psVar14,(set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                                         *)&__range2_1);
        if (bVar3) {
          psVar7 = GLRState::getName_abi_cxx11_(local_620);
          std::__cxx11::string::operator=((string *)local_5c0,(string *)psVar7);
          bVar1 = true;
          pGStack_5f8 = local_620;
        }
        std::_Rb_tree_const_iterator<GLRState_*>::operator++(&__end2_2);
      }
      if (!bVar1) {
        pGVar9 = (GLRState *)operator_new(0xb8);
        std::__cxx11::string::string((string *)&local_640,(string *)local_5c0);
        std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
                  (&local_670,
                   (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                   &__range2_1);
        GLRState::GLRState(pGVar9,&local_640,&local_670);
        pGStack_5f8 = pGVar9;
        std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::~set
                  (&local_670);
        std::__cxx11::string::~string((string *)&local_640);
        std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::insert
                  (&this->states,&stack0xfffffffffffffa08);
      }
      GLRState::addStateTo(pGStack_428,pGStack_5f8,(string *)&stateA);
      std::__cxx11::string::~string((string *)local_5c0);
      std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::~set
                ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                 &__range2_1);
      std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::~set
                ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                 &__range2);
      sImmRightX._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
    }
    else {
      sImmRightX._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0xe;
    }
    std::__cxx11::string::~string((string *)&stateA);
    if (sImmRightX._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0) {
      __end1_3 = std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::begin
                           (&this->states);
      state = (GLRState *)
              std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::end
                        (&this->states);
      while (bVar1 = std::operator!=(&__end1_3,(_Self *)&state), bVar1) {
        ppGVar13 = std::_Rb_tree_const_iterator<GLRState_*>::operator*(&__end1_3);
        pGVar9 = *ppGVar13;
        bVar1 = false;
        psVar14 = GLRState::getProductions(pGVar9);
        __end2_3 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::
                   begin(psVar14);
        rule = (Production *)
               std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::end
                         (psVar14);
        while (bVar3 = std::operator!=(&__end2_3,(_Self *)&rule), bVar3) {
          ppPVar17 = std::_Rb_tree_const_iterator<Production_*>::operator*(&__end2_3);
          prodTo_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = &(*ppPVar17)->fromP;
          pvVar4 = Production::getToP_abi_cxx11_
                             ((Production *)
                              prodTo_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_6e8,pvVar4);
          bVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_6e8);
          local_981 = false;
          if (!bVar3) {
            sVar18 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6e8);
            __lhs = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_6e8,sVar18 - 1);
            getMarker_abi_cxx11_();
            local_981 = std::operator==(__lhs,&local_708);
            std::__cxx11::string::~string((string *)&local_708);
          }
          if (local_981 != false) {
            bVar1 = true;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_6e8);
          std::_Rb_tree_const_iterator<Production_*>::operator++(&__end2_3);
        }
        if (bVar1) {
          GLRState::setAccepting(pGVar9,true);
        }
        std::_Rb_tree_const_iterator<GLRState_*>::operator++(&__end1_3);
      }
      std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::~set
                ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                 local_370);
      std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::~set
                ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                 &__range1_2);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string((string *)local_c8);
      std::vector<Production_*,_std::allocator<Production_*>_>::~vector
                ((vector<Production_*,_std::allocator<Production_*>_> *)((long)&startS.field_2 + 8))
      ;
      return;
    }
  } while( true );
}

Assistant:

GLRParser::GLRParser(CFG *cfg, bool verbose) : verbose(verbose) {

    cfg->splitUpLongerTerminals();

    // Convert vector to set
    for (const auto &c: cfg->getNonTerminalsV()) {
        nonTerminalsV.insert(c);
    }
    for (const auto &c: cfg->getTerminalsT()) {
        terminalsT.insert(c);
    }

    // TODO: fix all terminals only 1 char
    std::vector<Production *> productionsP = cfg->getProductionsP();
    std::string startS = cfg->getStartS();

    int stateNr = 1;

    // Start by creating a new start state
    std::string oldStartState = startS;
    startS = startStateName();
    stateNr++;
    nonTerminalsV.insert(startS);
    // and letting this start state point to the original one
    auto *start = new Production(startS, {oldStartState});
    // (This ensures the start state appears in only one rewrite rule)
    productionsP.push_back(start);

    acceptState = new GLRState("accept", {new Production("accept", {startS})});

    // Introduce the marker ^ in all productions
    std::set<Production *> markedProductions = {};
    for (auto production: productionsP) {
        const std::vector<std::string> &prodTo = production->getToP();
        for (int i = 0; i <= prodTo.size(); ++i) { // TODO: Check whether <= doesn't give an overflow error
            std::vector<std::string> prodToMarked = prodTo;
            prodToMarked.insert(prodToMarked.begin() + i, getMarker());
            auto *markedProduction = new Production(production->getFromP(), prodToMarked);
            markedProductions.insert(markedProduction);
            if (production->getFromP() == startS && i == 0) {
                start = markedProduction;
            }
        }
    }


    // 1. Form the closure of the set containing the single marked rule S' -> ^S. Establish this set as the initial ste
    //     in the transition diastagram.
    // Start state is the new start
    std::set<Production *> startClosure = {start};
    while (closure(startClosure, markedProductions)) {}
    auto *newState = new GLRState(startS, startClosure);
    states.insert(newState);
    startState = newState;
//    std::set<Production *> establishedRulesInState = startClosure;
    // States is the vector containing all established states
//    std::set<Production *> processedProductions = {};


    // 2. While possible without redundancy do the following:
    while ("Possible without redundancy") { // Redundant once all productions are processed
        // a. Select a symbol s (terminal or nonterminal) appearing emmediately to the right of the marker in a rule in
        //     some established state A.
        std::string s;
        GLRState *stateA{};
        for (int i = 0; i < states.size(); ++i) {
            // Get the i-th element
            auto glrStateItr = states.begin();
            std::advance(glrStateItr, i);
            GLRState *glrState = *glrStateItr;

            if (glrState->getProductions().size() <= glrState->getProdEstablished().size()) {
                continue;
            }

//            std::cout << glrState->getName() << " has " << glrState->getProdEstablished().size() << " of " << glrState->getProductions().size()  << " productions established."<< std::endl;

            auto productionItr = glrState->getProductions().begin();
            Production *production;
            while (true) {
                // Check whether the current production is already established
                if (std::find(glrState->getProdEstablished().begin(), glrState->getProdEstablished().end(),
                              *productionItr) == glrState->getProdEstablished().end()) {
                    production = *productionItr;
                    glrState->increaseEstablished(production);
                    break;
                } else {
                    // TODO: fix stuck in Moved loop
//                    std::cerr << "Moved" << std::endl;
                    productionItr++;
                }
            }


            s = symbolAfterMarker(production);
            // Marker at end
            if (s.empty()) {
                i--;
                continue;
            }
            stateA = glrState;
            break;

        }
        if (s.empty()) {
//            std::cout << "No more found." << std::endl;
            break;
        }

        // b. Let X denote the collection of all marked rules in A that have s immediately to the right of their markers.
        std::set<Production *> sImmRightX;
        for (Production *production: stateA->getProductions()) {
            if (s == symbolAfterMarker(production)) {
                sImmRightX.insert(production);
            }
        }

        // c. Let Y be the set of marked rules obtained by moving the marker in each rule in X to the right of the symbol s.
        std::set<Production *> sMovedRightOfX;
        for (Production *production: sImmRightX) {
            for (Production *prod: markedProductions) {
                if (isMarkerMovedRight(production, prod)) {
                    sMovedRightOfX.insert(prod);
                }
            }
        }

        // d. If the closure of Y has not yet been established as a state, do so now.

        // Find a new name for the variable
//        char newVariable = 'A';
//        while (inVector(toString(newVariable), nonTerminalsV)) { newVariable++; }
        std::string var = "STATE#" + std::to_string(stateNr++);
        nonTerminalsV.insert(var);

        // Calculate the closure
        while (closure(sMovedRightOfX, markedProductions)) {}

        // Find another state with this closure
        GLRState *closureY{};
        bool stateExists = false;
        for (GLRState *s2: states) {
            if (s2->getProductions() == sMovedRightOfX) {
                var = s2->getName();
                stateExists = true;
                closureY = s2;
            }
        }

        if (!stateExists) {
            closureY = new GLRState(var, sMovedRightOfX);
            states.insert(closureY);
        }

        // e. Draw an arc labeled s from state A to closure of Y
        stateA->addStateTo(closureY, s);
//        std::string filename = "output/yeet" + var + ".dot";
//        toDot(filename);
    }

    // 3. Let each state represented by marked rules in terminal form be accept states in the automaton.
    for (auto state: states) {
        bool containsTerminalProduction = false; // TODO: check containsProduction or allProductions
        for (auto rule: state->getProductions()) {
            auto prodTo = rule->getToP();
            if (!prodTo.empty() && prodTo[prodTo.size() - 1] == getMarker()) {
                containsTerminalProduction = true;
            }
        }
        if (containsTerminalProduction) {
            state->setAccepting(true);
        }
    }

//    toDot("output/GLRParserTransitionScheme.dot");
//    buildTable();
//    printTable();
}